

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

char Input::getChar(void)

{
  char cVar1;
  char *pcVar2;
  allocator local_69;
  string local_68;
  string local_48;
  undefined1 local_28 [8];
  regex charRegex;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_28,"[a-z]|[A-Z]",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"Enter a valid character!",&local_69);
  regexInputValidate(&local_48,(regex *)local_28,&local_68);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_48);
  cVar1 = *pcVar2;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_28);
  return cVar1;
}

Assistant:

char Input::getChar() {
    regex charRegex("[a-z]|[A-Z]");
    return regexInputValidate(charRegex, "Enter a valid character!")[0];
}